

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void start_tracking(void)

{
  long lVar1;
  double *pdVar2;
  int iVar3;
  int iVar4;
  ostream *poVar5;
  long lVar6;
  long lVar7;
  int iVar8;
  uint uVar9;
  int i;
  int iVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [64];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  double dVar31;
  undefined1 auVar32 [16];
  double dVar33;
  long trn;
  int x1;
  double local_58;
  int z1;
  int y1;
  undefined1 local_48 [16];
  
  if (mpi_rank == 0) {
    poVar5 = std::operator<<((ostream *)&std::cout,"Tracking started for particles: ");
    poVar5 = std::operator<<(poVar5,(string *)&particles_to_track_abi_cxx11_);
    std::endl<char,std::char_traits<char>>(poVar5);
  }
  if (((((((xtr1 < 0.0) || (xtr2 < 0.0)) || (ytr1 < 0.0)) || ((ytr2 < 0.0 || (ztr1 < 0.0)))) ||
       ((ztr2 < 0.0 || ((xlength <= xtr1 || (xlength <= xtr2)))))) || (ylength <= ytr1)) ||
     (((ylength <= ytr2 || (zlength <= ztr1)) || (zlength <= ztr2)))) {
    if (mpi_rank == 0) {
      poVar5 = std::operator<<((ostream *)&std::cout,
                               "Error - tracks outside of compulational domain");
      std::endl<char,std::char_traits<char>>(poVar5);
      return;
    }
  }
  else {
    trn = 1;
    if (tr_init == false) {
      auVar22 = ZEXT864(0);
      iVar10 = -1;
      iVar3 = n_tracks;
      for (iVar4 = 0; iVar4 < iVar3; iVar4 = iVar4 + 1) {
        dVar31 = (double)iVar4;
        dVar33 = (double)iVar3;
        auVar29._8_8_ = 0;
        auVar29._0_8_ = ztr1;
        auVar27 = vmovhpd_avx(auVar29,ytr1);
        iVar8 = (int)((xtr1 + ((xtr2 - xtr1) * dVar31) / dVar33) / dx);
        auVar24._8_8_ = 0;
        auVar24._0_8_ = ztr2;
        auVar24 = vmovhpd_avx(auVar24,ytr2);
        auVar24 = vsubpd_avx(auVar24,auVar27);
        auVar25._0_8_ = auVar24._0_8_ * dVar31;
        auVar25._8_8_ = auVar24._8_8_ * dVar31;
        auVar32._8_8_ = dVar33;
        auVar32._0_8_ = dVar33;
        auVar24 = vdivpd_avx(auVar25,auVar32);
        auVar26._0_8_ = auVar27._0_8_ + auVar24._0_8_;
        auVar26._8_8_ = auVar27._8_8_ + auVar24._8_8_;
        auVar30._8_8_ = 0;
        auVar30._0_8_ = dz;
        auVar24 = vmovhpd_avx(auVar30,dy);
        auVar24 = vdivpd_avx(auVar26,auVar24);
        auVar27._0_4_ = (int)auVar24._0_8_;
        auVar27._4_4_ = (int)auVar24._8_8_;
        auVar27._8_8_ = 0;
        if (((iVar10 != iVar8) ||
            (uVar11 = vpcmpeqd_avx512vl(auVar22._0_16_,auVar27), ((uVar11 & 0xf) >> 1 & 1) == 0)) ||
           ((uVar11 & 1) == 0)) {
          local_48 = auVar27;
          uVar9 = get_sr_for_index(iVar8);
          uVar11 = (ulong)uVar9;
          iVar10 = iVar8 - x0_sr.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start[(int)uVar9];
          if ((0 < (int)uVar9) && (iVar10 < nm)) {
            uVar11 = (ulong)(uVar9 - 1);
            iVar10 = (iVar10 + nx_sr.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start[uVar11]) - nx_ich;
          }
          if (mpi_rank == (int)uVar11) {
            lVar1 = *(long *)(*(long *)(*(long *)(*(long *)((long)psr._M_t.
                                                  super___uniq_ptr_impl<spatial_region,_std::default_delete<spatial_region>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_spatial_region_*,_std::default_delete<spatial_region>_>
                                                  .super__Head_base<0UL,_spatial_region_*,_false>.
                                                  _M_head_impl + 0x218) + (long)iVar10 * 8) +
                                       (long)(int)local_48._4_4_ * 8) +
                             (long)(int)local_48._0_4_ * 0x10);
            lVar6 = std::__cxx11::string::find('`',0x65);
            if (lVar6 != -1) {
              lVar7 = trn;
              lVar6 = lVar1;
              for (uVar12 = 1; (lVar6 != 0 && ((char)uVar12 != '\0')); uVar12 = uVar12 & 1) {
                dVar31 = *(double *)(lVar6 + 0x40);
                auVar18._8_8_ = 0;
                auVar18._0_8_ = dVar31;
                if ((dVar31 == -1.0) && (!NAN(dVar31))) {
                  *(int *)(lVar6 + 0x50) = (int)lVar7;
                  lVar7 = lVar7 + 1;
                  trn = lVar7;
                }
                lVar6 = *(long *)(lVar6 + 0x58);
                uVar12 = vcmpsd_avx512f(auVar18,ZEXT816(0xbff0000000000000),4);
              }
            }
            lVar6 = std::__cxx11::string::find('`',0x70);
            if (lVar6 != -1) {
              lVar7 = trn;
              lVar6 = lVar1;
              for (uVar12 = 1; (lVar6 != 0 && ((char)uVar12 != '\0')); uVar12 = uVar12 & 1) {
                dVar31 = *(double *)(lVar6 + 0x40);
                auVar19._8_8_ = 0;
                auVar19._0_8_ = dVar31;
                if ((dVar31 == 1.0) && (!NAN(dVar31))) {
                  *(int *)(lVar6 + 0x50) = (int)lVar7;
                  lVar7 = lVar7 + 1;
                  trn = lVar7;
                }
                lVar6 = *(long *)(lVar6 + 0x58);
                uVar12 = vcmpsd_avx512f(auVar19,ZEXT816(0x3ff0000000000000),4);
              }
            }
            lVar6 = std::__cxx11::string::find('`',0x67);
            if (lVar6 != -1) {
              lVar7 = trn;
              lVar6 = lVar1;
              for (uVar12 = 1; (lVar6 != 0 && ((char)uVar12 != '\0')); uVar12 = uVar12 & 1) {
                dVar31 = *(double *)(lVar6 + 0x40);
                auVar20._8_8_ = 0;
                auVar20._0_8_ = dVar31;
                if ((dVar31 == 0.0) && (!NAN(dVar31))) {
                  *(int *)(lVar6 + 0x50) = (int)lVar7;
                  lVar7 = lVar7 + 1;
                  trn = lVar7;
                }
                lVar6 = *(long *)(lVar6 + 0x58);
                uVar12 = vcmpsd_avx512f(ZEXT816(0),auVar20,4);
              }
            }
            lVar6 = std::__cxx11::string::find('`',0x69);
            pdVar2 = icmr;
            if (lVar6 != -1) {
              uVar9 = ~(n_ion_populations >> 0x1f) & n_ion_populations;
              lVar6 = trn;
              for (uVar12 = 0; uVar12 != uVar9; uVar12 = uVar12 + 1) {
                lVar7 = lVar1;
                for (uVar13 = 1; (lVar7 != 0 && ((char)uVar13 != '\0')); uVar13 = uVar13 & 1) {
                  dVar31 = *(double *)(lVar7 + 0x40);
                  auVar21._8_8_ = 0;
                  auVar21._0_8_ = dVar31;
                  dVar33 = pdVar2[uVar12];
                  auVar28._8_8_ = 0;
                  auVar28._0_8_ = dVar33;
                  if ((dVar31 == dVar33) && (!NAN(dVar31) && !NAN(dVar33))) {
                    *(int *)(lVar7 + 0x50) = (int)lVar6;
                    lVar6 = lVar6 + 1;
                    trn = lVar6;
                  }
                  lVar7 = *(long *)(lVar7 + 0x58);
                  uVar13 = vcmpsd_avx512f(auVar21,auVar28,4);
                }
              }
            }
          }
          MPI_Bcast(&trn,1,&ompi_mpi_long,uVar11,&ompi_mpi_comm_world);
          auVar22 = ZEXT1664(local_48);
          iVar3 = n_tracks;
          iVar10 = iVar8;
        }
      }
    }
    else {
      for (iVar10 = 0; iVar10 < n_tracks; iVar10 = iVar10 + 1) {
        local_58 = xtr2 - xtr1;
        local_48._0_8_ = xtr1;
        iVar3 = rand();
        dVar31 = ((double)iVar3 * local_58) / 2147483647.0 + (double)local_48._0_8_;
        local_48._0_8_ = ytr1;
        x1 = (int)(dVar31 / dx);
        local_58 = ytr2 - ytr1;
        iVar3 = rand();
        dVar31 = ((double)iVar3 * local_58) / 2147483647.0 + (double)local_48._0_8_;
        local_48._0_8_ = ztr1;
        y1 = (int)(dVar31 / dy);
        local_58 = ztr2 - ztr1;
        iVar3 = rand();
        z1 = (int)((((double)iVar3 * local_58) / 2147483647.0 + (double)local_48._0_8_) / dz);
        MPI_Bcast(&x1,1,&ompi_mpi_int,0,&ompi_mpi_comm_world);
        MPI_Bcast(&y1,1,&ompi_mpi_int,0,&ompi_mpi_comm_world);
        MPI_Bcast(&z1,1,&ompi_mpi_int,0,&ompi_mpi_comm_world);
        iVar4 = get_sr_for_index(x1);
        iVar8 = x1 - x0_sr.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[iVar4];
        iVar3 = 0;
        if ((iVar4 != 0) && (iVar3 = iVar4, iVar8 < nm)) {
          iVar3 = iVar4 + -1;
          iVar8 = (iVar8 + nx_sr.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start[(long)iVar4 + -1]) - nx_ich;
        }
        if (mpi_rank == iVar3) {
          lVar1 = *(long *)(*(long *)(*(long *)(*(long *)((long)psr._M_t.
                                                  super___uniq_ptr_impl<spatial_region,_std::default_delete<spatial_region>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_spatial_region_*,_std::default_delete<spatial_region>_>
                                                  .super__Head_base<0UL,_spatial_region_*,_false>.
                                                  _M_head_impl + 0x218) + (long)iVar8 * 8) +
                                     (long)y1 * 8) + (long)z1 * 0x10);
          lVar6 = std::__cxx11::string::find('`',0x65);
          if (lVar6 != -1) {
            lVar7 = trn;
            lVar6 = lVar1;
            for (uVar11 = 1; (lVar6 != 0 && ((char)uVar11 != '\0')); uVar11 = uVar11 & 1) {
              dVar31 = *(double *)(lVar6 + 0x40);
              auVar14._8_8_ = 0;
              auVar14._0_8_ = dVar31;
              if ((dVar31 == -1.0) && (!NAN(dVar31))) {
                *(int *)(lVar6 + 0x50) = (int)lVar7;
                lVar7 = lVar7 + 1;
                trn = lVar7;
              }
              lVar6 = *(long *)(lVar6 + 0x58);
              uVar11 = vcmpsd_avx512f(auVar14,ZEXT816(0xbff0000000000000),4);
            }
          }
          lVar6 = std::__cxx11::string::find('`',0x70);
          if (lVar6 != -1) {
            lVar7 = trn;
            lVar6 = lVar1;
            for (uVar11 = 1; (lVar6 != 0 && ((char)uVar11 != '\0')); uVar11 = uVar11 & 1) {
              dVar31 = *(double *)(lVar6 + 0x40);
              auVar15._8_8_ = 0;
              auVar15._0_8_ = dVar31;
              if ((dVar31 == 1.0) && (!NAN(dVar31))) {
                *(int *)(lVar6 + 0x50) = (int)lVar7;
                lVar7 = lVar7 + 1;
                trn = lVar7;
              }
              lVar6 = *(long *)(lVar6 + 0x58);
              uVar11 = vcmpsd_avx512f(auVar15,ZEXT816(0x3ff0000000000000),4);
            }
          }
          lVar6 = std::__cxx11::string::find('`',0x67);
          if (lVar6 != -1) {
            lVar7 = trn;
            lVar6 = lVar1;
            for (uVar11 = 1; (lVar6 != 0 && ((char)uVar11 != '\0')); uVar11 = uVar11 & 1) {
              dVar31 = *(double *)(lVar6 + 0x40);
              auVar16._8_8_ = 0;
              auVar16._0_8_ = dVar31;
              if ((dVar31 == 0.0) && (!NAN(dVar31))) {
                *(int *)(lVar6 + 0x50) = (int)lVar7;
                lVar7 = lVar7 + 1;
                trn = lVar7;
              }
              lVar6 = *(long *)(lVar6 + 0x58);
              uVar11 = vcmpsd_avx512f(ZEXT816(0),auVar16,4);
            }
          }
          lVar6 = std::__cxx11::string::find('`',0x69);
          pdVar2 = icmr;
          if (lVar6 != -1) {
            uVar9 = ~(n_ion_populations >> 0x1f) & n_ion_populations;
            lVar6 = trn;
            for (uVar11 = 0; uVar11 != uVar9; uVar11 = uVar11 + 1) {
              lVar7 = lVar1;
              for (uVar12 = 1; (lVar7 != 0 && ((char)uVar12 != '\0')); uVar12 = uVar12 & 1) {
                dVar31 = *(double *)(lVar7 + 0x40);
                auVar17._8_8_ = 0;
                auVar17._0_8_ = dVar31;
                dVar33 = pdVar2[uVar11];
                auVar23._8_8_ = 0;
                auVar23._0_8_ = dVar33;
                if ((dVar31 == dVar33) && (!NAN(dVar31) && !NAN(dVar33))) {
                  *(int *)(lVar7 + 0x50) = (int)lVar6;
                  lVar6 = lVar6 + 1;
                  trn = lVar6;
                }
                lVar7 = *(long *)(lVar7 + 0x58);
                uVar12 = vcmpsd_avx512f(auVar17,auVar23,4);
              }
            }
          }
        }
        MPI_Bcast(&trn,1,&ompi_mpi_long,iVar3,&ompi_mpi_comm_world);
      }
    }
    synchronize_regions(false);
  }
  return;
}

Assistant:

void start_tracking()
{
    if (mpi_rank == 0) {
        cout << "Tracking started for particles: " << particles_to_track << endl;
    }
    if (xtr1 < 0 || xtr2 < 0 || ytr1 < 0 || ytr2 < 0 || ztr1 < 0 || ztr2 < 0 ||
        xtr1 >= xlength || xtr2 >= xlength || ytr1 >= ylength || ytr2 >= ylength || ztr1 >= zlength || ztr2 >= zlength)
    {
        if (mpi_rank == 0) {
            cout << "Error - tracks outside of compulational domain" << endl;
        }
        return;
    }
    long trn = 1; // trn = 0 for untracked particles
    if (tr_init==0) {
        int x1,y1,z1,x2,y2,z2;
        x1 = -1;
        y1 = 0;
        z1 = 0;
        for (int i=0;i<n_tracks;i++) {
            x2 = (xtr1 + (xtr2-xtr1)*i/n_tracks)/dx;
            y2 = (ytr1 + (ytr2-ytr1)*i/n_tracks)/dy;
            z2 = (ztr1 + (ztr2-ztr1)*i/n_tracks)/dz;
            if (x2!=x1 || y2!=y1 || z2!=z1) {
                x1 = x2;
                y1 = y2;
                z1 = z2;
                int n,x;
                n = get_sr_for_index(x2);
                x = x2 - x0_sr[n];
                if (n>0 && x<nm) {
                    n = n - 1;
                    x = x + nx_sr[n] - nx_ich;
                }
                if (mpi_rank == n) {
                    particle* h = psr->cp[x][y2][z2].pl.head;
                    particle* p = h;
                    bool b = 1;
                    if (particles_to_track.find('e') != string::npos)
                    {
                        while (p!=0 && b) {
                            if (p->cmr==-1) {
                                p->trn = trn;
                                trn++;
                                b = 0;
                            }
                            p = p->next;
                        }
                    }
                    if (particles_to_track.find('p') != string::npos)
                    {
                        p = h;
                        b = 1;
                        while (p!=0 && b) {
                            if (p->cmr==1) {
                                p->trn = trn;
                                trn++;
                                b = 0;
                            }
                            p = p->next;
                        }
                    }
                    if (particles_to_track.find('g') != string::npos)
                    {
                        p = h;
                        b = 1;
                        while (p!=0 && b) {
                            if (p->cmr==0) {
                                p->trn = trn;
                                trn++;
                                b = 0;
                            }
                            p = p->next;
                        }
                    }
                    if (particles_to_track.find('i') != string::npos)
                    {
                        for (int m=0;m<n_ion_populations;m++) {
                            p = h;
                            b = 1;
                            while (p!=0 && b) {
                                if (p->cmr==icmr[m]) {
                                    p->trn = trn;
                                    trn++;
                                    b = 0;
                                }
                                p = p->next;
                            }
                        }
                    }
                }
                MPI_Bcast(&trn, 1, MPI_LONG, n, MPI_COMM_WORLD);
            }
        }
    } else {
        for (int i=0;i<n_tracks;i++) {
            int x1 = ( xtr1 + ( xtr2 - xtr1 ) * rand( ) / RAND_MAX ) / dx;
            int y1 = ( ytr1 + ( ytr2 - ytr1 ) * rand( ) / RAND_MAX ) / dy;
            int z1 = ( ztr1 + ( ztr2 - ztr1 ) * rand( ) / RAND_MAX ) / dz;
            MPI_Bcast(&x1, 1, MPI_INT, 0, MPI_COMM_WORLD);
            MPI_Bcast(&y1, 1, MPI_INT, 0, MPI_COMM_WORLD);
            MPI_Bcast(&z1, 1, MPI_INT, 0, MPI_COMM_WORLD);

            int n,x;
            n = get_sr_for_index(x1);
            x = x1 - x0_sr[n];
            if (n!=0 && x<nm) {
                n = n - 1;
                x = x + nx_sr[n] - nx_ich;
            }
            if (mpi_rank == n) {
                particle* h = psr->cp[x][y1][z1].pl.head;
                particle* p = h;
                bool b = 1;
                if (particles_to_track.find('e') != string::npos)
                {
                    while (p!=0 && b) {
                        if (p->cmr==-1) {
                            p->trn = trn;
                            trn++;
                            b = 0;
                        }
                        p = p->next;
                    }
                }
                if (particles_to_track.find('p') != string::npos)
                {
                    p = h;
                    b = 1;
                    while (p!=0 && b) {
                        if (p->cmr==1) {
                            p->trn = trn;
                            trn++;
                            b = 0;
                        }
                        p = p->next;
                    }
                }
                if (particles_to_track.find('g') != string::npos)
                {
                    p = h;
                    b = 1;
                    while (p!=0 && b) {
                        if (p->cmr==0) {
                            p->trn = trn;
                            trn++;
                            b = 0;
                        }
                        p = p->next;
                    }
                }
                if (particles_to_track.find('i') != string::npos)
                {
                    for (int m=0;m<n_ion_populations;m++) {
                        p = h;
                        b = 1;
                        while (p!=0 && b) {
                            if (p->cmr==icmr[m]) {
                                p->trn = trn;
                                trn++;
                                b = 0;
                            }
                            p = p->next;
                        }
                    }
                }
            }
            MPI_Bcast(&trn, 1, MPI_LONG, n, MPI_COMM_WORLD);
        }
    }

    // make the same particles tracked in all regions, so that tracks aren't lost at the first exchange
    synchronize_regions(false);
}